

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *vecset,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *coScaleval,
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          *scaleval,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *epsilon)

{
  uint *puVar1;
  long lVar2;
  pointer pnVar3;
  bool bVar4;
  type_conflict5 tVar5;
  double *pdVar6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  long lVar7;
  long *plVar8;
  int j;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_298;
  long local_290;
  soplex *local_288;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *local_280;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_278;
  double local_270;
  cpp_dec_float<100U,_int,_void> local_268;
  cpp_dec_float<100U,_int,_void> local_218;
  pointer local_1c8;
  pointer pnStack_1c0;
  pointer local_1b8;
  pointer pnStack_1b0;
  pointer local_1a8;
  pointer pnStack_1a0;
  pointer local_198;
  pointer pnStack_190;
  int local_188;
  bool local_184;
  pointer local_180;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_80;
  
  lVar7 = 0;
  local_298 = __return_storage_ptr__;
  local_280 = coScaleval;
  local_278 = vecset;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,0.0,(type *)0x0);
  local_288 = this;
  do {
    if (*(int *)(local_288 + 0x38) <= lVar7) {
      return local_298;
    }
    plVar8 = (long *)((long)*(int *)(*(long *)(local_288 + 0x28) + 4 + lVar7 * 8) * 0x28 +
                     *(long *)(local_288 + 0x20));
    local_290 = lVar7;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&local_218,0.0,(type *)0x0);
    pdVar6 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&local_268,*pdVar6,(type *)0x0);
    lVar7 = 0;
    for (lVar9 = 0; lVar9 < *(int *)((long)plVar8 + 0xc); lVar9 = lVar9 + 1) {
      lVar2 = *plVar8;
      local_d8.fpclass = cpp_dec_float_finite;
      local_d8.prec_elem = 0x10;
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      local_d8.data._M_elems[2] = 0;
      local_d8.data._M_elems[3] = 0;
      local_d8.data._M_elems[4] = 0;
      local_d8.data._M_elems[5] = 0;
      local_d8.data._M_elems[6] = 0;
      local_d8.data._M_elems[7] = 0;
      local_d8.data._M_elems[8] = 0;
      local_d8.data._M_elems[9] = 0;
      local_d8.data._M_elems[10] = 0;
      local_d8.data._M_elems[0xb] = 0;
      local_d8.data._M_elems[0xc] = 0;
      local_d8.data._M_elems[0xd] = 0;
      local_d8.data._M_elems._56_5_ = 0;
      local_d8.data._M_elems[0xf]._1_3_ = 0;
      local_d8.exp = 0;
      local_d8.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_d8,(cpp_dec_float<100U,_int,_void> *)(lVar2 + lVar7),
                 (cpp_dec_float<100U,_int,_void> *)
                 ((local_278->
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  )._vptr_ClassArray + (ulong)*(uint *)(lVar2 + 0x50 + lVar7) * 10));
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((type *)&local_2e8,(multiprecision *)&local_d8,arg);
      local_178.m_backend.data._M_elems[0xf]._1_3_ = local_2e8.data._M_elems[0xf]._1_3_;
      local_178.m_backend.data._M_elems._56_5_ = local_2e8.data._M_elems._56_5_;
      local_178.m_backend.data._M_elems[0xc] = local_2e8.data._M_elems[0xc];
      local_178.m_backend.data._M_elems[0xd] = local_2e8.data._M_elems[0xd];
      local_178.m_backend.data._M_elems[8] = local_2e8.data._M_elems[8];
      local_178.m_backend.data._M_elems[9] = local_2e8.data._M_elems[9];
      local_178.m_backend.data._M_elems[10] = local_2e8.data._M_elems[10];
      local_178.m_backend.data._M_elems[0xb] = local_2e8.data._M_elems[0xb];
      local_178.m_backend.data._M_elems[4] = local_2e8.data._M_elems[4];
      local_178.m_backend.data._M_elems[5] = local_2e8.data._M_elems[5];
      local_178.m_backend.data._M_elems[6] = local_2e8.data._M_elems[6];
      local_178.m_backend.data._M_elems[7] = local_2e8.data._M_elems[7];
      local_178.m_backend.data._M_elems[0] = local_2e8.data._M_elems[0];
      local_178.m_backend.data._M_elems[1] = local_2e8.data._M_elems[1];
      local_178.m_backend.data._M_elems[2] = local_2e8.data._M_elems[2];
      local_178.m_backend.data._M_elems[3] = local_2e8.data._M_elems[3];
      local_178.m_backend.exp = local_2e8.exp;
      local_178.m_backend.neg = local_2e8.neg;
      local_178.m_backend.fpclass = local_2e8.fpclass;
      local_178.m_backend.prec_elem = local_2e8.prec_elem;
      local_1c8 = (scaleval->
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      pnStack_1c0 = (scaleval->
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
      local_1b8 = (scaleval->
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
      pnStack_1b0 = scaleval[1].
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_1a8 = scaleval[1].
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      pnStack_1a0 = scaleval[1].
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_198 = scaleval[2].
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pnStack_190 = scaleval[2].
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      local_188 = *(int *)&scaleval[2].
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_184 = *(bool *)((long)&scaleval[2].
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      local_180 = scaleval[3].
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_178,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_1c8);
      if (!bVar4) {
        tVar5 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_2e8,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_218);
        if (tVar5) {
          local_218.data._M_elems[0xf]._1_3_ = local_2e8.data._M_elems[0xf]._1_3_;
          local_218.data._M_elems._56_5_ = local_2e8.data._M_elems._56_5_;
          local_218.data._M_elems[0xc] = local_2e8.data._M_elems[0xc];
          local_218.data._M_elems[0xd] = local_2e8.data._M_elems[0xd];
          local_218.data._M_elems[8] = local_2e8.data._M_elems[8];
          local_218.data._M_elems[9] = local_2e8.data._M_elems[9];
          local_218.data._M_elems[10] = local_2e8.data._M_elems[10];
          local_218.data._M_elems[0xb] = local_2e8.data._M_elems[0xb];
          local_218.data._M_elems[4] = local_2e8.data._M_elems[4];
          local_218.data._M_elems[5] = local_2e8.data._M_elems[5];
          local_218.data._M_elems[6] = local_2e8.data._M_elems[6];
          local_218.data._M_elems[7] = local_2e8.data._M_elems[7];
          local_218.data._M_elems[0] = local_2e8.data._M_elems[0];
          local_218.data._M_elems[1] = local_2e8.data._M_elems[1];
          local_218.data._M_elems[2] = local_2e8.data._M_elems[2];
          local_218.data._M_elems[3] = local_2e8.data._M_elems[3];
          local_218.exp = local_2e8.exp;
          local_218.neg = local_2e8.neg;
          local_218.fpclass = local_2e8.fpclass;
          local_218.prec_elem = local_2e8.prec_elem;
        }
        tVar5 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_2e8,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_268);
        if (tVar5) {
          local_268.data._M_elems[0xf]._1_3_ = local_2e8.data._M_elems[0xf]._1_3_;
          local_268.data._M_elems._56_5_ = local_2e8.data._M_elems._56_5_;
          local_268.data._M_elems[0xc] = local_2e8.data._M_elems[0xc];
          local_268.data._M_elems[0xd] = local_2e8.data._M_elems[0xd];
          local_268.data._M_elems[8] = local_2e8.data._M_elems[8];
          local_268.data._M_elems[9] = local_2e8.data._M_elems[9];
          local_268.data._M_elems[10] = local_2e8.data._M_elems[10];
          local_268.data._M_elems[0xb] = local_2e8.data._M_elems[0xb];
          local_268.data._M_elems[4] = local_2e8.data._M_elems[4];
          local_268.data._M_elems[5] = local_2e8.data._M_elems[5];
          local_268.data._M_elems[6] = local_2e8.data._M_elems[6];
          local_268.data._M_elems[7] = local_2e8.data._M_elems[7];
          local_268.data._M_elems[0] = local_2e8.data._M_elems[0];
          local_268.data._M_elems[1] = local_2e8.data._M_elems[1];
          local_268.data._M_elems[2] = local_2e8.data._M_elems[2];
          local_268.data._M_elems[3] = local_2e8.data._M_elems[3];
          local_268.exp = local_2e8.exp;
          local_268.neg = local_2e8.neg;
          local_268.fpclass = local_2e8.fpclass;
          local_268.prec_elem = local_2e8.prec_elem;
        }
      }
      lVar7 = lVar7 + 0x54;
    }
    pdVar6 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&local_2e8,*pdVar6,(type *)0x0);
    bVar4 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_268,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_2e8);
    if (bVar4) {
LAB_00133964:
      lVar7 = local_290;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_268,1.0);
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_218,1.0);
    }
    else {
      local_80.data._M_elems[0] = 0;
      local_80.data._M_elems[1] = 0;
      tVar5 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_218,(double *)&local_80);
      lVar7 = local_290;
      if (tVar5) goto LAB_00133964;
    }
    local_270 = 1.0;
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 0x10;
    local_128.data._M_elems[0] = 0;
    local_128.data._M_elems[1] = 0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems[6] = 0;
    local_128.data._M_elems[7] = 0;
    local_128.data._M_elems[8] = 0;
    local_128.data._M_elems[9] = 0;
    local_128.data._M_elems[10] = 0;
    local_128.data._M_elems[0xb] = 0;
    local_128.data._M_elems[0xc] = 0;
    local_128.data._M_elems[0xd] = 0;
    local_128.data._M_elems._56_5_ = 0;
    local_128.data._M_elems[0xf]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_128,&local_268,&local_218);
    boost::multiprecision::sqrt<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              ((type *)&local_80,(multiprecision *)&local_128,arg_00);
    local_2e8.fpclass = cpp_dec_float_finite;
    local_2e8.prec_elem = 0x10;
    local_2e8.data._M_elems[0] = 0;
    local_2e8.data._M_elems[1] = 0;
    local_2e8.data._M_elems[2] = 0;
    local_2e8.data._M_elems[3] = 0;
    local_2e8.data._M_elems[4] = 0;
    local_2e8.data._M_elems[5] = 0;
    local_2e8.data._M_elems[6] = 0;
    local_2e8.data._M_elems[7] = 0;
    local_2e8.data._M_elems[8] = 0;
    local_2e8.data._M_elems[9] = 0;
    local_2e8.data._M_elems[10] = 0;
    local_2e8.data._M_elems[0xb] = 0;
    local_2e8.data._M_elems[0xc] = 0;
    local_2e8.data._M_elems[0xd] = 0;
    local_2e8.data._M_elems._56_5_ = 0;
    local_2e8.data._M_elems[0xf]._1_3_ = 0;
    local_2e8.exp = 0;
    local_2e8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
              (&local_2e8,&local_270,&local_80);
    pnVar3 = (local_280->
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (uint *)((long)pnVar3[lVar7].m_backend.data._M_elems + 0x30);
    *(undefined8 *)puVar1 = local_2e8.data._M_elems._48_8_;
    *(ulong *)(puVar1 + 2) =
         CONCAT35(local_2e8.data._M_elems[0xf]._1_3_,local_2e8.data._M_elems._56_5_);
    puVar1 = (uint *)((long)pnVar3[lVar7].m_backend.data._M_elems + 0x20);
    *(undefined8 *)puVar1 = local_2e8.data._M_elems._32_8_;
    *(undefined8 *)(puVar1 + 2) = local_2e8.data._M_elems._40_8_;
    puVar1 = (uint *)((long)pnVar3[lVar7].m_backend.data._M_elems + 0x10);
    *(undefined8 *)puVar1 = local_2e8.data._M_elems._16_8_;
    *(undefined8 *)(puVar1 + 2) = local_2e8.data._M_elems._24_8_;
    *(undefined8 *)pnVar3[lVar7].m_backend.data._M_elems = local_2e8.data._M_elems._0_8_;
    *(undefined8 *)((long)pnVar3[lVar7].m_backend.data._M_elems + 8) = local_2e8.data._M_elems._8_8_
    ;
    pnVar3[lVar7].m_backend.exp = local_2e8.exp;
    pnVar3[lVar7].m_backend.neg = local_2e8.neg;
    pnVar3[lVar7].m_backend.fpclass = local_2e8.fpclass;
    pnVar3[lVar7].m_backend.prec_elem = local_2e8.prec_elem;
    local_2e8.fpclass = cpp_dec_float_finite;
    local_2e8.prec_elem = 0x10;
    local_2e8.data._M_elems[0] = 0;
    local_2e8.data._M_elems[1] = 0;
    local_2e8.data._M_elems[2] = 0;
    local_2e8.data._M_elems[3] = 0;
    local_2e8.data._M_elems[4] = 0;
    local_2e8.data._M_elems[5] = 0;
    local_2e8.data._M_elems[6] = 0;
    local_2e8.data._M_elems[7] = 0;
    local_2e8.data._M_elems[8] = 0;
    local_2e8.data._M_elems[9] = 0;
    local_2e8.data._M_elems[10] = 0;
    local_2e8.data._M_elems[0xb] = 0;
    local_2e8.data._M_elems[0xc] = 0;
    local_2e8.data._M_elems[0xd] = 0;
    local_2e8.data._M_elems._56_5_ = 0;
    local_2e8.data._M_elems[0xf]._1_3_ = 0;
    local_2e8.exp = 0;
    local_2e8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_2e8,&local_218,&local_268);
    tVar5 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_2e8,local_298);
    if (tVar5) {
      *(undefined8 *)((local_298->m_backend).data._M_elems + 0xc) = local_2e8.data._M_elems._48_8_;
      *(ulong *)((local_298->m_backend).data._M_elems + 0xe) =
           CONCAT35(local_2e8.data._M_elems[0xf]._1_3_,local_2e8.data._M_elems._56_5_);
      *(undefined8 *)((local_298->m_backend).data._M_elems + 8) = local_2e8.data._M_elems._32_8_;
      *(undefined8 *)((local_298->m_backend).data._M_elems + 10) = local_2e8.data._M_elems._40_8_;
      *(undefined8 *)((local_298->m_backend).data._M_elems + 4) = local_2e8.data._M_elems._16_8_;
      *(undefined8 *)((local_298->m_backend).data._M_elems + 6) = local_2e8.data._M_elems._24_8_;
      *(undefined8 *)(local_298->m_backend).data._M_elems = local_2e8.data._M_elems._0_8_;
      *(undefined8 *)((local_298->m_backend).data._M_elems + 2) = local_2e8.data._M_elems._8_8_;
      (local_298->m_backend).exp = local_2e8.exp;
      (local_298->m_backend).neg = local_2e8.neg;
      (local_298->m_backend).fpclass = local_2e8.fpclass;
      (local_298->m_backend).prec_elem = local_2e8.prec_elem;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static R computeScalingVec(
   const SVSetBase<R>*   vecset, const std::vector<R>& coScaleval,
   std::vector<R>&       scaleval, R epsilon)
{
   R pmax = 0.0;

   assert(scaleval.size() == unsigned(vecset->num()));

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;
      R mini = R(infinity);

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(vec.value(j) * coScaleval[unsigned(vec.index(j))]);

         if(!isZero(x, epsilon))
         {
            if(x > maxi)
               maxi = x;

            if(x < mini)
               mini = x;
         }
      }

      // empty rows/cols are possible
      if(mini == R(infinity) || maxi == 0.0)
      {
         mini = 1.0;
         maxi = 1.0;
      }

      assert(mini < R(infinity));
      assert(maxi > 0.0);

      scaleval[unsigned(i)] = 1.0 / spxSqrt(mini * maxi);

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}